

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

int reverse_jmp_opcode(int opcode)

{
  int local_c;
  int opcode_local;
  
  switch(opcode) {
  case 0x1c:
    local_c = 0x1f;
    break;
  case 0x1d:
    local_c = 0x1e;
    break;
  case 0x1e:
    local_c = 0x1d;
    break;
  case 0x1f:
    local_c = 0x1c;
    break;
  case 0x20:
    local_c = 0x21;
    break;
  case 0x21:
    local_c = 0x20;
    break;
  default:
    lc_error("Cannot reverse comparison jmp opcode %i.",(ulong)(uint)opcode);
    local_c = 0;
  }
  return local_c;
}

Assistant:

int reverse_jmp_opcode(int opcode)
{
	switch (opcode) {
	case SPO_JE:	return SPO_JNE;
	case SPO_JNE:	return SPO_JE;
	case SPO_JL:	return SPO_JGE;
	case SPO_JG:	return SPO_JLE;
	case SPO_JLE:	return SPO_JG;
	case SPO_JGE:	return SPO_JL;
	default:
	    lc_error("Cannot reverse comparison jmp opcode %i.", opcode);
	    return SPO_NULL;
	}
}